

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O0

size_t __thiscall
cubeb_resampler_speex_one_way<float>::output
          (cubeb_resampler_speex_one_way<float> *this,float *output_buffer,size_t output_frame_count
          )

{
  uint uVar1;
  size_t sVar2;
  uint in_EDX;
  float *in_RDI;
  uint32_t out_len;
  uint32_t in_len;
  processor *this_00;
  float *in_stack_ffffffffffffffd8;
  auto_array<float> *this_01;
  
  this_00 = (processor *)(in_RDI + 2);
  sVar2 = auto_array<float>::length((auto_array<float> *)(in_RDI + 8));
  sVar2 = processor::samples_to_frames(this_00,sVar2);
  uVar1 = (uint)sVar2;
  auto_array<float>::data((auto_array<float> *)(in_RDI + 8));
  speex_resample((cubeb_resampler_speex_one_way<float> *)CONCAT44(uVar1,in_EDX),
                 in_stack_ffffffffffffffd8,(uint32_t *)in_RDI,(float *)this_00,(uint32_t *)0x11c584)
  ;
  this_01 = (auto_array<float> *)(in_RDI + 8);
  processor::frames_to_samples((processor *)(in_RDI + 2),(ulong)uVar1);
  auto_array<float>::pop(this_01,in_RDI,(size_t)this_00);
  return (ulong)in_EDX;
}

Assistant:

size_t output(T * output_buffer, size_t output_frame_count)
  {
    uint32_t in_len = samples_to_frames(resampling_in_buffer.length());
    uint32_t out_len = output_frame_count;

    speex_resample(resampling_in_buffer.data(), &in_len, output_buffer,
                   &out_len);

    /* This shifts back any unresampled samples to the beginning of the input
       buffer. */
    resampling_in_buffer.pop(nullptr, frames_to_samples(in_len));

    return out_len;
  }